

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::
MatcherBase<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::$_0_const&>
::
GetDescriberImpl<testing::internal::MatcherBase<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::__0_const&>::ValuePolicy<testing::MatcherInterface<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::__0_const&>const*,true>>
          (MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
           *m)

{
  __tuple_element_t<1UL,_tuple<const_MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>_*,_const_MatcherInterface<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>_*>_>
  *ppMVar1;
  MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
  *local_28;
  tuple<const_testing::internal::MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>_*,_const_testing::MatcherInterface<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>_*>
  local_20;
  MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
  *local_10;
  MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
  *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<const_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp:79:5)_&>
  ::
  ValuePolicy<const_testing::MatcherInterface<const_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp:79:5)_&>_*,_true>
  ::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::__0_const&>const*,testing::MatcherInterface<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::__0_const&>const*>
            ((MatcherBase<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
              **)&local_20,
             (MatcherInterface<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
              **)&local_28);
  ppMVar1 = std::
            get<1ul,testing::internal::MatcherBase<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::__0_const&>const*,testing::MatcherInterface<(anonymous_namespace)::RomFactory_fails_if_mapper_not_supported_Test::TestBody()::__0_const&>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }